

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O0

void __thiscall CMainParams::CMainParams(CMainParams *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<AssumeutxoData> __l_01;
  initializer_list<std::pair<const_int,_uint256>_> __l_02;
  bool bVar1;
  reference pvVar2;
  uchar *puVar3;
  allocator_type *__a;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_unsigned_int>_>,_bool> pVar4;
  CBlock *in_stack_fffffffffffffa08;
  CBlock *in_stack_fffffffffffffa10;
  CBlock *in_stack_fffffffffffffa18;
  CCheckpointData *this_00;
  allocator_type *in_stack_fffffffffffffa20;
  CBlockHeader *in_stack_fffffffffffffa28;
  vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> *this_01;
  iterator in_stack_fffffffffffffa30;
  uint8_t *puVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffa38;
  uchar *__last;
  allocator_type *__a_00;
  CAmount *in_stack_fffffffffffffa58;
  less<int> *__comp;
  undefined8 in_stack_fffffffffffffa60;
  map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_> *this_02;
  CChainParams *in_stack_fffffffffffffa68;
  iterator ppVar6;
  undefined1 *puVar7;
  undefined1 local_4c3 [33];
  undefined1 local_4a2 [32];
  undefined1 local_482 [32];
  undefined1 local_462;
  uchar local_461;
  undefined8 local_448;
  undefined4 local_440;
  undefined4 local_43c;
  undefined1 local_438;
  undefined1 local_437;
  undefined1 local_436;
  undefined1 local_435;
  undefined1 local_434;
  undefined1 local_433;
  undefined1 local_432;
  undefined1 local_431;
  _Base_ptr local_430;
  undefined1 local_428;
  _Base_ptr local_420;
  undefined1 local_418;
  undefined1 local_410;
  undefined1 local_40f;
  undefined1 local_40e;
  undefined1 local_40d;
  undefined1 local_40c;
  undefined1 local_40b;
  undefined1 local_40a;
  undefined1 local_409;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_406;
  undefined1 local_405;
  undefined1 local_404;
  undefined1 local_403;
  undefined1 local_402;
  undefined1 local_401;
  undefined1 local_400;
  undefined1 local_3ff;
  undefined1 local_3fe;
  undefined1 local_3fd;
  undefined1 local_3fc;
  undefined1 local_3fb;
  undefined1 local_3fa;
  undefined1 local_3f9;
  undefined1 local_3f8;
  undefined1 local_3f7;
  undefined1 local_3f6;
  undefined1 local_3f5;
  undefined1 local_3f4;
  undefined1 local_3f3;
  undefined1 local_3f2;
  undefined1 local_3f1;
  undefined4 local_3f0;
  undefined8 local_3c8;
  undefined1 local_3c0;
  undefined1 local_3bf;
  undefined1 local_3be;
  undefined1 local_3bd;
  undefined1 local_3bc;
  undefined1 local_3bb;
  undefined1 local_3ba;
  undefined1 local_3b9;
  undefined1 local_3b8;
  undefined1 local_3b7;
  undefined1 local_3b6;
  undefined1 local_3b5;
  undefined1 local_3b4;
  undefined1 local_3b3;
  undefined1 local_3b2;
  undefined1 local_3b1;
  undefined1 local_3b0;
  undefined1 local_3af;
  undefined1 local_3ae;
  undefined1 local_3ad;
  undefined1 local_3ac;
  undefined1 local_3ab;
  undefined1 local_3aa;
  undefined1 local_3a9;
  undefined1 local_3a8;
  undefined1 local_3a7;
  undefined1 local_3a6;
  undefined1 local_3a5;
  undefined1 local_3a4;
  undefined1 local_3a3;
  undefined1 local_3a2;
  undefined1 local_3a1;
  undefined1 local_39c [468];
  CCheckpointData local_1c8;
  undefined1 local_198;
  undefined1 local_197;
  undefined1 local_196;
  undefined1 local_195;
  undefined1 local_194;
  undefined1 local_193;
  undefined1 local_192;
  undefined1 local_191;
  undefined1 local_190;
  undefined1 local_18f;
  undefined1 local_18e;
  undefined1 local_18d;
  undefined1 local_18c;
  undefined1 local_18b;
  undefined1 local_18a;
  undefined1 local_189;
  undefined1 local_188;
  undefined1 local_187;
  undefined1 local_186;
  undefined1 local_185;
  undefined1 local_184;
  undefined1 local_183;
  undefined1 local_182;
  undefined1 local_181;
  undefined1 local_180;
  undefined1 local_17f;
  undefined1 local_17e;
  undefined1 local_17d;
  undefined1 local_17c;
  undefined1 local_17b;
  undefined1 local_17a;
  undefined1 local_179;
  undefined1 local_178;
  undefined1 local_177;
  undefined1 local_176;
  undefined1 local_175;
  undefined1 local_174;
  undefined1 local_173;
  undefined1 local_172;
  undefined1 local_171;
  undefined1 local_170;
  undefined1 local_16f;
  undefined1 local_16e;
  undefined1 local_16d;
  undefined1 local_16c;
  undefined1 local_16b;
  undefined1 local_16a;
  undefined1 local_169;
  undefined1 local_168;
  undefined1 local_167;
  undefined1 local_166;
  undefined1 local_165;
  undefined1 local_164;
  undefined1 local_163;
  undefined1 local_162;
  undefined1 local_161;
  undefined1 local_160;
  undefined1 local_15f;
  undefined1 local_15e;
  undefined1 local_15d;
  undefined1 local_15c;
  undefined1 local_15b;
  undefined1 local_15a;
  undefined1 local_159;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 local_c8;
  undefined1 uStack_c7;
  undefined1 uStack_c6;
  undefined1 uStack_c5;
  undefined1 uStack_c4;
  undefined1 uStack_c3;
  undefined1 uStack_c2;
  undefined1 uStack_c1;
  undefined1 uStack_c0;
  undefined1 uStack_bf;
  undefined1 uStack_be;
  undefined1 uStack_bd;
  undefined1 uStack_bc;
  undefined1 uStack_bb;
  undefined1 uStack_ba;
  undefined1 uStack_b9;
  undefined1 local_b8;
  undefined1 uStack_b7;
  undefined1 uStack_b6;
  undefined1 uStack_b5;
  undefined1 uStack_b4;
  undefined1 uStack_b3;
  undefined1 uStack_b2;
  undefined1 uStack_b1;
  undefined1 uStack_b0;
  undefined1 uStack_af;
  undefined1 uStack_ae;
  undefined1 uStack_ad;
  undefined1 uStack_ac;
  undefined1 uStack_ab;
  undefined1 uStack_aa;
  undefined1 uStack_a9;
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  undefined1 uStack_a0;
  undefined1 uStack_9f;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  undefined1 uStack_9c;
  undefined1 uStack_9b;
  undefined1 uStack_9a;
  undefined1 uStack_99;
  undefined1 local_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined1 uStack_8a;
  undefined1 uStack_89;
  undefined1 local_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  undefined1 uStack_80;
  undefined1 uStack_7f;
  undefined1 uStack_7e;
  undefined1 uStack_7d;
  undefined1 uStack_7c;
  undefined1 uStack_7b;
  undefined1 uStack_7a;
  undefined1 uStack_79;
  undefined1 local_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined1 uStack_72;
  undefined1 uStack_71;
  undefined1 uStack_70;
  undefined1 uStack_6f;
  undefined1 uStack_6e;
  undefined1 uStack_6d;
  undefined1 uStack_6c;
  undefined1 uStack_6b;
  undefined1 uStack_6a;
  undefined1 uStack_69;
  undefined1 local_68;
  undefined1 uStack_67;
  undefined1 uStack_66;
  undefined1 uStack_65;
  undefined1 uStack_64;
  undefined1 uStack_63;
  undefined1 uStack_62;
  undefined1 uStack_61;
  undefined1 uStack_60;
  undefined1 uStack_5f;
  undefined1 uStack_5e;
  undefined1 uStack_5d;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  undefined1 local_58;
  undefined1 uStack_57;
  undefined1 uStack_56;
  undefined1 uStack_55;
  undefined1 uStack_54;
  undefined1 uStack_53;
  undefined1 uStack_52;
  undefined1 uStack_51;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  undefined1 local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  undefined1 local_30;
  undefined1 local_2f;
  undefined1 local_2e;
  undefined1 local_2d;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  undefined1 local_28;
  undefined1 local_27;
  undefined1 local_26;
  undefined1 local_25;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  undefined1 local_20;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  undefined1 local_18;
  undefined1 local_17;
  undefined1 local_16;
  undefined1 local_15;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  undefined1 local_10;
  undefined1 local_f;
  undefined1 local_e;
  undefined1 local_d;
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::CChainParams(in_stack_fffffffffffffa68);
  *(undefined4 *)(in_RDI + 0x48) = 0;
  *(undefined1 *)(in_RDI + 0x2a) = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa08);
  *(undefined4 *)(in_RDI + 4) = 210000;
  local_9 = 0;
  local_a = 0;
  local_b = 0;
  local_c = 0;
  local_d = 0;
  local_e = 0;
  local_f = 2;
  local_10 = 0xdc;
  local_11 = 0x75;
  local_12 = 0x6e;
  local_13 = 0xeb;
  local_14 = 0xf4;
  local_15 = 0xf4;
  local_16 = 0x97;
  local_17 = 0x23;
  local_18 = 0xed;
  local_19 = 0x8d;
  local_1a = 0x30;
  local_1b = 0xcc;
  local_1c = 0x28;
  local_1d = 0xa5;
  local_1e = 0xf1;
  local_1f = 8;
  local_20 = 0xeb;
  local_21 = 0x94;
  local_22 = 0xb1;
  local_23 = 0xba;
  local_24 = 0x88;
  local_25 = 0xac;
  local_26 = 0x4f;
  local_27 = 0x9c;
  local_28 = 0x22;
  local_43c = 0;
  pVar4 = std::
          map<uint256,unsigned_int,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
          ::emplace<uint256,__0>
                    ((map<uint256,_unsigned_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
                      *)in_stack_fffffffffffffa28,(uint256 *)in_stack_fffffffffffffa20,
                     (anon_enum_32 *)in_stack_fffffffffffffa18);
  local_420 = (_Base_ptr)pVar4.first._M_node;
  local_418 = pVar4.second;
  local_29 = 0;
  local_2a = 0;
  local_2b = 0;
  local_2c = 0;
  local_2d = 0;
  local_2e = 0;
  local_2f = 0;
  local_30 = 0;
  local_31 = 0;
  local_32 = 0xf;
  local_33 = 0x14;
  local_34 = 0xc3;
  local_35 = 0x5b;
  local_36 = 0x2d;
  local_37 = 0x84;
  local_38 = 0x1e;
  local_39 = 0x98;
  local_3a = 0x6a;
  local_3b = 0xb5;
  local_3c = 0x44;
  local_3d = 0x1d;
  local_3e = 0xe8;
  local_3f = 0xc5;
  local_40 = 0x85;
  local_41 = 0xd5;
  local_42 = 0xff;
  local_43 = 0xe5;
  local_44 = 0x5e;
  local_45 = 0xa1;
  local_46 = 0xe3;
  local_47 = 0x95;
  local_48 = 0xad;
  local_440 = 0x801;
  pVar4 = std::
          map<uint256,unsigned_int,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
          ::emplace<uint256,unsigned_int>
                    ((map<uint256,_unsigned_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
                      *)in_stack_fffffffffffffa28,(uint256 *)in_stack_fffffffffffffa20,
                     (uint *)in_stack_fffffffffffffa18);
  local_430 = (_Base_ptr)pVar4.first._M_node;
  local_428 = pVar4.second;
  *(undefined4 *)(in_RDI + 0xb) = 0x37a5b;
  uStack_49 = 0;
  uStack_4a = 0;
  uStack_4b = 0;
  uStack_4c = 0;
  uStack_4d = 0;
  uStack_4e = 0;
  uStack_4f = 2;
  uStack_50 = 0x4b;
  uStack_51 = 0x89;
  uStack_52 = 0xb4;
  uStack_53 = 0x2a;
  uStack_54 = 0x94;
  uStack_55 = 0x2f;
  uStack_56 = 0xe0;
  uStack_57 = 0xd9;
  local_58 = 0xfe;
  uStack_59 = 0xa3;
  uStack_5a = 0xbb;
  uStack_5b = 0x44;
  uStack_5c = 0xab;
  uStack_5d = 0x7b;
  uStack_5e = 0xd1;
  uStack_5f = 0xb1;
  uStack_60 = 0x91;
  uStack_61 = 0x15;
  uStack_62 = 0xdd;
  uStack_63 = 0x6a;
  uStack_64 = 0x75;
  uStack_65 = 0x9c;
  uStack_66 = 8;
  uStack_67 = 8;
  local_68 = 0xb8;
  *(undefined8 *)((long)in_RDI + 0x6c) = 0x89b42a942fe0d9fe;
  *(undefined8 *)((long)in_RDI + 0x74) = 0x24b;
  *(undefined8 *)((long)in_RDI + 0x5c) = 0x15dd6a759c0808b8;
  *(undefined8 *)((long)in_RDI + 100) = 0xa3bb44ab7bd1b191;
  *(undefined4 *)((long)in_RDI + 0x7c) = 0x5ed1d;
  *(undefined4 *)(in_RDI + 0x10) = 0x58ccd;
  *(undefined4 *)((long)in_RDI + 0x84) = 0x66600;
  *(undefined4 *)(in_RDI + 0x11) = 0x75a20;
  *(undefined4 *)((long)in_RDI + 0x8c) = 0x76200;
  uStack_69 = 0;
  uStack_6a = 0;
  uStack_6b = 0;
  uStack_6c = 0;
  uStack_6d = 0xff;
  uStack_6e = 0xff;
  uStack_6f = 0xff;
  uStack_70 = 0xff;
  uStack_71 = 0xff;
  uStack_72 = 0xff;
  uStack_73 = 0xff;
  uStack_74 = 0xff;
  uStack_75 = 0xff;
  uStack_76 = 0xff;
  uStack_77 = 0xff;
  local_78 = 0xff;
  uStack_79 = 0xff;
  uStack_7a = 0xff;
  uStack_7b = 0xff;
  uStack_7c = 0xff;
  uStack_7d = 0xff;
  uStack_7e = 0xff;
  uStack_7f = 0xff;
  uStack_80 = 0xff;
  uStack_81 = 0xff;
  uStack_82 = 0xff;
  uStack_83 = 0xff;
  uStack_84 = 0xff;
  uStack_85 = 0xff;
  uStack_86 = 0xff;
  uStack_87 = 0xff;
  local_88 = 0xff;
  in_RDI[0x1d] = 0xffffffffffffffff;
  in_RDI[0x1e] = 0xffffffff;
  in_RDI[0x1b] = 0xffffffffffffffff;
  in_RDI[0x1c] = 0xffffffffffffffff;
  in_RDI[0x21] = 0x127500;
  in_RDI[0x20] = 600;
  *(undefined1 *)(in_RDI + 0x1f) = 0;
  *(undefined1 *)((long)in_RDI + 0xf9) = 0;
  *(undefined1 *)((long)in_RDI + 0xfa) = 0;
  *(undefined4 *)(in_RDI + 0x12) = 0x717;
  *(undefined4 *)((long)in_RDI + 0x94) = 0x7e0;
  *(undefined4 *)(in_RDI + 0x13) = 0x1c;
  in_RDI[0x14] = 0xfffffffffffffffe;
  in_RDI[0x15] = 0x7fffffffffffffff;
  *(undefined4 *)(in_RDI + 0x16) = 0;
  *(undefined4 *)(in_RDI + 0x17) = 2;
  in_RDI[0x18] = 0x60835f80;
  in_RDI[0x19] = 0x61131300;
  *(undefined4 *)(in_RDI + 0x1a) = 0xad400;
  uStack_89 = 0;
  uStack_8a = 0;
  uStack_8b = 0;
  uStack_8c = 0;
  uStack_8d = 0;
  uStack_8e = 0;
  uStack_8f = 0;
  uStack_90 = 0;
  uStack_91 = 0;
  uStack_92 = 0;
  uStack_93 = 0;
  uStack_94 = 0;
  uStack_95 = 0;
  uStack_96 = 0;
  uStack_97 = 0;
  local_98 = 0;
  uStack_99 = 0;
  uStack_9a = 0;
  uStack_9b = 0;
  uStack_9c = 0;
  uStack_9d = 0x88;
  uStack_9e = 0xe1;
  uStack_9f = 0x86;
  uStack_a0 = 0xb7;
  uStack_a1 = 0xe;
  uStack_a2 = 8;
  uStack_a3 = 0x62;
  uStack_a4 = 0xc1;
  uStack_a5 = 0x93;
  uStack_a6 = 0xec;
  uStack_a7 = 0x44;
  local_a8 = 0xd6;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  in_RDI[0x22] = 0xe0862c193ec44d6;
  in_RDI[0x23] = 0x88e186b7;
  uStack_a9 = 0;
  uStack_aa = 0;
  uStack_ab = 0;
  uStack_ac = 0;
  uStack_ad = 0;
  uStack_ae = 0;
  uStack_af = 0;
  uStack_b0 = 0;
  uStack_b1 = 0;
  uStack_b2 = 1;
  uStack_b3 = 0x1c;
  uStack_b4 = 0x58;
  uStack_b5 = 0x90;
  uStack_b6 = 0x36;
  uStack_b7 = 0x5b;
  local_b8 = 0xdb;
  uStack_b9 = 0xe5;
  uStack_ba = 0xd2;
  uStack_bb = 0x5b;
  uStack_bc = 0x97;
  uStack_bd = 0xce;
  uStack_be = 0;
  uStack_bf = 0x57;
  uStack_c0 = 0x58;
  uStack_c1 = 0x9a;
  uStack_c2 = 0xca;
  uStack_c3 = 0xef;
  uStack_c4 = 0x4f;
  uStack_c5 = 0x1a;
  uStack_c6 = 0x57;
  uStack_c7 = 0x26;
  local_c8 = 0x3f;
  in_RDI[0x28] = 0x11c5890365bdb;
  in_RDI[0x29] = 0;
  in_RDI[0x26] = 0x9acaef4f1a57263f;
  in_RDI[0x27] = 0xe5d25b97ce005758;
  pvVar2 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffa18,
                      (size_type)in_stack_fffffffffffffa10);
  *pvVar2 = 0xf9;
  pvVar2 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffa18,
                      (size_type)in_stack_fffffffffffffa10);
  *pvVar2 = 0xbe;
  pvVar2 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffa18,
                      (size_type)in_stack_fffffffffffffa10);
  *pvVar2 = 0xb4;
  pvVar2 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffa18,
                      (size_type)in_stack_fffffffffffffa10);
  *pvVar2 = 0xd9;
  *(undefined2 *)((long)in_RDI + 0x174) = 0x208d;
  in_RDI[0x2f] = 100000;
  in_RDI[0x30] = 0x26c;
  in_RDI[0x31] = 0xe;
  local_448 = 5000000000;
  CreateGenesisBlock((uint32_t)((ulong)in_stack_fffffffffffffa68 >> 0x20),
                     (uint32_t)in_stack_fffffffffffffa68,
                     (uint32_t)((ulong)in_stack_fffffffffffffa60 >> 0x20),
                     (int32_t)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  CBlock::operator=(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
  CBlock::~CBlock(in_stack_fffffffffffffa08);
  CBlockHeader::GetHash(in_stack_fffffffffffffa28);
  in_RDI[2] = local_148;
  in_RDI[3] = uStack_140;
  *in_RDI = local_158;
  in_RDI[1] = uStack_150;
  local_159 = 0;
  local_15a = 0;
  local_15b = 0;
  local_15c = 0;
  local_15d = 0;
  local_15e = 0x19;
  local_15f = 0xd6;
  local_160 = 0x68;
  local_161 = 0x9c;
  local_162 = 8;
  local_163 = 0x5a;
  local_164 = 0xe1;
  local_165 = 0x65;
  local_166 = 0x83;
  local_167 = 0x1e;
  local_168 = 0x93;
  local_169 = 0x4f;
  local_16a = 0xf7;
  local_16b = 99;
  local_16c = 0xae;
  local_16d = 0x46;
  local_16e = 0xa2;
  local_16f = 0xa6;
  local_170 = 0xc1;
  local_171 = 0x72;
  local_172 = 0xb3;
  local_173 = 0xf1;
  local_174 = 0xb6;
  local_175 = 10;
  local_176 = 0x8c;
  local_177 = 0xe2;
  local_178 = 0x6f;
  bVar1 = ::operator==((base_blob<256U> *)in_stack_fffffffffffffa18,
                       (base_blob<256U> *)in_stack_fffffffffffffa10);
  if (!bVar1) {
    __assert_fail("consensus.hashGenesisBlock == uint256{\"000000000019d6689c085ae165831e934ff763ae46a2a6c172b3f1b60a8ce26f\"}"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x8b,"CMainParams::CMainParams()");
  }
  local_179 = 0x4a;
  local_17a = 0x5e;
  local_17b = 0x1e;
  local_17c = 0x4b;
  local_17d = 0xaa;
  local_17e = 0xb8;
  local_17f = 0x9f;
  local_180 = 0x3a;
  local_181 = 0x32;
  local_182 = 0x51;
  local_183 = 0x8a;
  local_184 = 0x88;
  local_185 = 0xc3;
  local_186 = 0x1b;
  local_187 = 200;
  local_188 = 0x7f;
  local_189 = 0x61;
  local_18a = 0x8f;
  local_18b = 0x76;
  local_18c = 0x67;
  local_18d = 0x3e;
  local_18e = 0x2c;
  local_18f = 199;
  local_190 = 0x7a;
  local_191 = 0xb2;
  local_192 = 0x12;
  local_193 = 0x7b;
  local_194 = 0x7a;
  local_195 = 0xfd;
  local_196 = 0xed;
  local_197 = 0xa3;
  local_198 = 0x3b;
  bVar1 = ::operator==((base_blob<256U> *)in_stack_fffffffffffffa18,
                       (base_blob<256U> *)in_stack_fffffffffffffa10);
  if (!bVar1) {
    __assert_fail("genesis.hashMerkleRoot == uint256{\"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b\"}"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x8c,"CMainParams::CMainParams()");
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[22]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffa28,(char (*) [22])in_stack_fffffffffffffa20);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[21]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffa28,(char (*) [21])in_stack_fffffffffffffa20);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[45]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffa28,(char (*) [45])in_stack_fffffffffffffa20);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[31]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffa28,(char (*) [31])in_stack_fffffffffffffa20);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[24]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffa28,(char (*) [24])in_stack_fffffffffffffa20);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[27]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffa28,(char (*) [27])in_stack_fffffffffffffa20);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[17]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffa28,(char (*) [17])in_stack_fffffffffffffa20);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[22]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffa28,(char (*) [22])in_stack_fffffffffffffa20);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[29]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffa28,(char (*) [29])in_stack_fffffffffffffa20);
  local_461 = '\0';
  puVar7 = &local_462;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffa08);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffa38,(size_type)in_stack_fffffffffffffa30,
             (value_type_conflict *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa18,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa18);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffa08);
  local_482[1] = 5;
  ppVar6 = (iterator)local_482;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffa08);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffa38,(size_type)in_stack_fffffffffffffa30,
             (value_type_conflict *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  __comp = (less<int> *)(local_482 + 2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa18,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa18);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffa08);
  local_4a2[1] = 0x80;
  this_02 = (map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_> *)
            local_4a2;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffa08);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffa38,(size_type)in_stack_fffffffffffffa30,
             (value_type_conflict *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  __a_00 = (allocator_type *)(local_4a2 + 2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa18,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa18);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffa08);
  local_434 = 4;
  local_433 = 0x88;
  local_432 = 0xb2;
  local_431 = 0x1e;
  __l._M_len = (size_type)in_stack_fffffffffffffa38;
  __l._M_array = in_stack_fffffffffffffa30;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa28,__l)
  ;
  local_438 = 4;
  local_437 = 0x88;
  local_436 = 0xad;
  local_435 = 0xe4;
  __l_00._M_len = (size_type)in_stack_fffffffffffffa38;
  __l_00._M_array = in_stack_fffffffffffffa30;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa28,
             __l_00);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18,(char *)in_stack_fffffffffffffa10);
  puVar5 = chainparams_seed_main;
  puVar3 = std::begin<unsigned_char_const,51360ul>((uchar (*) [51360])in_stack_fffffffffffffa08);
  __a = (allocator_type *)
        std::end<unsigned_char_const,51360ul>((uchar (*) [51360])in_stack_fffffffffffffa08);
  __last = local_4c3 + 2;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffa08);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a_00,(uchar *)__comp,__last,
             __a);
  this_00 = (CCheckpointData *)(local_4c3 + 3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffa08);
  *(undefined1 *)(in_RDI + 0x5a) = 0;
  *(undefined1 *)((long)in_RDI + 0x2d1) = 0;
  memcpy(local_39c,&DAT_0049ab30,0x1d4);
  this_01 = (vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> *)local_4c3;
  std::allocator<std::pair<const_int,_uint256>_>::allocator
            ((allocator<std::pair<const_int,_uint256>_> *)in_stack_fffffffffffffa08);
  __l_02._M_len = (size_type)puVar7;
  __l_02._M_array = ppVar6;
  std::map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>::map
            (this_02,__l_02,__comp,__a_00);
  CCheckpointData::operator=(this_00,&local_1c8);
  CCheckpointData::~CCheckpointData((CCheckpointData *)in_stack_fffffffffffffa08);
  std::allocator<std::pair<const_int,_uint256>_>::~allocator
            ((allocator<std::pair<const_int,_uint256>_> *)in_stack_fffffffffffffa08);
  local_3f0 = 840000;
  local_3f1 = 0xa2;
  local_3f2 = 0xa5;
  local_3f3 = 0x52;
  local_3f4 = 0x1b;
  local_3f5 = 0x1b;
  local_3f6 = 0x5a;
  local_3f7 = 0xb6;
  local_3f8 = 0x5f;
  local_3f9 = 0x67;
  local_3fa = 0x81;
  local_3fb = 0x8e;
  local_3fc = 0x5e;
  local_3fd = 0x8e;
  local_3fe = 0xcc;
  local_3ff = 0xab;
  local_400 = 0xb7;
  local_401 = 0x17;
  local_402 = 0x1a;
  local_403 = 0x51;
  local_404 = 0x7f;
  local_405 = 0x9e;
  local_406 = 0x23;
  local_407 = 0x82;
  local_408 = 0x20;
  local_409 = 0x8f;
  local_40a = 0x77;
  local_40b = 0x68;
  local_40c = 0x73;
  local_40d = 0x10;
  local_40e = 0x76;
  local_40f = 0x8f;
  local_410 = 0x96;
  AssumeutxoHash::AssumeutxoHash((AssumeutxoHash *)in_stack_fffffffffffffa08,(uint256 *)0x1e0d07);
  local_3c8 = 0x3b11f382;
  local_3a1 = 0;
  local_3a2 = 0;
  local_3a3 = 0;
  local_3a4 = 0;
  local_3a5 = 0;
  local_3a6 = 0;
  local_3a7 = 0;
  local_3a8 = 0;
  local_3a9 = 0;
  local_3aa = 3;
  local_3ab = 0x20;
  local_3ac = 0x28;
  local_3ad = 0x3a;
  local_3ae = 3;
  local_3af = 0x27;
  local_3b0 = 0x48;
  local_3b1 = 0xce;
  local_3b2 = 0xf8;
  local_3b3 = 0x22;
  local_3b4 = 0x78;
  local_3b5 = 0x73;
  local_3b6 = 0xff;
  local_3b7 = 0x48;
  local_3b8 = 0x72;
  local_3b9 = 0x68;
  local_3ba = 0x9b;
  local_3bb = 0xf2;
  local_3bc = 0x3f;
  local_3bd = 0x1c;
  local_3be = 0xda;
  local_3bf = 0x83;
  local_3c0 = 0xa5;
  __l_01._M_len = (size_type)puVar3;
  __l_01._M_array = (iterator)puVar5;
  std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>::operator=(this_01,__l_01);
  in_RDI[0x66] = 0x401ae2648d5c33d6;
  *(undefined4 *)(in_RDI + 100) = 0x66bccc78;
  *(undefined4 *)((long)in_RDI + 0x324) = 0;
  *(undefined4 *)(in_RDI + 0x65) = 0x3f23d4b5;
  *(undefined4 *)((long)in_RDI + 0x32c) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CMainParams() {
        m_chain_type = ChainType::MAIN;
        consensus.signet_blocks = false;
        consensus.signet_challenge.clear();
        consensus.nSubsidyHalvingInterval = 210000;
        consensus.script_flag_exceptions.emplace( // BIP16 exception
            uint256{"00000000000002dc756eebf4f49723ed8d30cc28a5f108eb94b1ba88ac4f9c22"}, SCRIPT_VERIFY_NONE);
        consensus.script_flag_exceptions.emplace( // Taproot exception
            uint256{"0000000000000000000f14c35b2d841e986ab5441de8c585d5ffe55ea1e395ad"}, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS);
        consensus.BIP34Height = 227931;
        consensus.BIP34Hash = uint256{"000000000000024b89b42a942fe0d9fea3bb44ab7bd1b19115dd6a759c0808b8"};
        consensus.BIP65Height = 388381; // 000000000000000004c2b624ed5d7756c508d90fd0da2c7c679febfa6c4735f0
        consensus.BIP66Height = 363725; // 00000000000000000379eaa19dce8c9b722d46ae6a57c2f1a988119488b50931
        consensus.CSVHeight = 419328; // 000000000000000004a1b34462cb8aeebd5799177f7a29cf28f2d1961716b5b5
        consensus.SegwitHeight = 481824; // 0000000000000000001c8018d9cb3b742ef25114f27563e3fc4a1902167f9893
        consensus.MinBIP9WarningHeight = 483840; // segwit activation height + miner confirmation window
        consensus.powLimit = uint256{"00000000ffffffffffffffffffffffffffffffffffffffffffffffffffffffff"};
        consensus.nPowTargetTimespan = 14 * 24 * 60 * 60; // two weeks
        consensus.nPowTargetSpacing = 10 * 60;
        consensus.fPowAllowMinDifficultyBlocks = false;
        consensus.enforce_BIP94 = false;
        consensus.fPowNoRetargeting = false;
        consensus.nRuleChangeActivationThreshold = 1815; // 90% of 2016
        consensus.nMinerConfirmationWindow = 2016; // nPowTargetTimespan / nPowTargetSpacing
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].bit = 28;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nStartTime = Consensus::BIP9Deployment::NEVER_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].min_activation_height = 0; // No activation delay

        // Deployment of Taproot (BIPs 340-342)
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].bit = 2;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nStartTime = 1619222400; // April 24th, 2021
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nTimeout = 1628640000; // August 11th, 2021
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].min_activation_height = 709632; // Approximately November 12th, 2021

        consensus.nMinimumChainWork = uint256{"000000000000000000000000000000000000000088e186b70e0862c193ec44d6"};
        consensus.defaultAssumeValid = uint256{"000000000000000000011c5890365bdbe5d25b97ce0057589acaef4f1a57263f"}; // 856760

        /**
         * The message start string is designed to be unlikely to occur in normal data.
         * The characters are rarely used upper ASCII, not valid as UTF-8, and produce
         * a large 32-bit integer with any alignment.
         */
        pchMessageStart[0] = 0xf9;
        pchMessageStart[1] = 0xbe;
        pchMessageStart[2] = 0xb4;
        pchMessageStart[3] = 0xd9;
        nDefaultPort = 8333;
        nPruneAfterHeight = 100000;
        m_assumed_blockchain_size = 620;
        m_assumed_chain_state_size = 14;

        genesis = CreateGenesisBlock(1231006505, 2083236893, 0x1d00ffff, 1, 50 * COIN);
        consensus.hashGenesisBlock = genesis.GetHash();
        assert(consensus.hashGenesisBlock == uint256{"000000000019d6689c085ae165831e934ff763ae46a2a6c172b3f1b60a8ce26f"});
        assert(genesis.hashMerkleRoot == uint256{"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b"});

        // Note that of those which support the service bits prefix, most only support a subset of
        // possible options.
        // This is fine at runtime as we'll fall back to using them as an addrfetch if they don't support the
        // service bits we want, but we should get them updated to support all service bits wanted by any
        // release ASAP to avoid it where possible.
        vSeeds.emplace_back("seed.bitcoin.sipa.be."); // Pieter Wuille, only supports x1, x5, x9, and xd
        vSeeds.emplace_back("dnsseed.bluematt.me."); // Matt Corallo, only supports x9
        vSeeds.emplace_back("dnsseed.bitcoin.dashjr-list-of-p2p-nodes.us."); // Luke Dashjr
        vSeeds.emplace_back("seed.bitcoin.jonasschnelli.ch."); // Jonas Schnelli, only supports x1, x5, x9, and xd
        vSeeds.emplace_back("seed.btc.petertodd.net."); // Peter Todd, only supports x1, x5, x9, and xd
        vSeeds.emplace_back("seed.bitcoin.sprovoost.nl."); // Sjors Provoost
        vSeeds.emplace_back("dnsseed.emzy.de."); // Stephan Oeste
        vSeeds.emplace_back("seed.bitcoin.wiz.biz."); // Jason Maurice
        vSeeds.emplace_back("seed.mainnet.achownodes.xyz."); // Ava Chow, only supports x1, x5, x9, x49, x809, x849, xd, x400, x404, x408, x448, xc08, xc48, x40c

        base58Prefixes[PUBKEY_ADDRESS] = std::vector<unsigned char>(1,0);
        base58Prefixes[SCRIPT_ADDRESS] = std::vector<unsigned char>(1,5);
        base58Prefixes[SECRET_KEY] =     std::vector<unsigned char>(1,128);
        base58Prefixes[EXT_PUBLIC_KEY] = {0x04, 0x88, 0xB2, 0x1E};
        base58Prefixes[EXT_SECRET_KEY] = {0x04, 0x88, 0xAD, 0xE4};

        bech32_hrp = "bc";

        vFixedSeeds = std::vector<uint8_t>(std::begin(chainparams_seed_main), std::end(chainparams_seed_main));

        fDefaultConsistencyChecks = false;
        m_is_mockable_chain = false;

        checkpointData = {
            {
                { 11111, uint256{"0000000069e244f73d78e8fd29ba2fd2ed618bd6fa2ee92559f542fdb26e7c1d"}},
                { 33333, uint256{"000000002dd5588a74784eaa7ab0507a18ad16a236e7b1ce69f00d7ddfb5d0a6"}},
                { 74000, uint256{"0000000000573993a3c9e41ce34471c079dcf5f52a0e824a81e7f953b8661a20"}},
                {105000, uint256{"00000000000291ce28027faea320c8d2b054b2e0fe44a773f3eefb151d6bdc97"}},
                {134444, uint256{"00000000000005b12ffd4cd315cd34ffd4a594f430ac814c91184a0d42d2b0fe"}},
                {168000, uint256{"000000000000099e61ea72015e79632f216fe6cb33d7899acb35b75c8303b763"}},
                {193000, uint256{"000000000000059f452a5f7340de6682a977387c17010ff6e6c3bd83ca8b1317"}},
                {210000, uint256{"000000000000048b95347e83192f69cf0366076336c639f9b7228e9ba171342e"}},
                {216116, uint256{"00000000000001b4f4b433e81ee46494af945cf96014816a4e2370f11b23df4e"}},
                {225430, uint256{"00000000000001c108384350f74090433e7fcf79a606b8e797f065b130575932"}},
                {250000, uint256{"000000000000003887df1f29024b06fc2200b55f8af8f35453d7be294df2d214"}},
                {279000, uint256{"0000000000000001ae8c72a0b0c301f67e3afca10e819efa9041e458e9bd7e40"}},
                {295000, uint256{"00000000000000004d9b4ef50f0f9d686fd69db2e03af35a100370c64632a983"}},
            }
        };

        m_assumeutxo_data = {
            {
                .height = 840'000,
                .hash_serialized = AssumeutxoHash{uint256{"a2a5521b1b5ab65f67818e5e8eccabb7171a517f9e2382208f77687310768f96"}},
                .m_chain_tx_count = 991032194,
                .blockhash = consteval_ctor(uint256{"0000000000000000000320283a032748cef8227873ff4872689bf23f1cda83a5"}),
            }
        };

        chainTxData = ChainTxData{
            // Data from RPC: getchaintxstats 4096 000000000000000000011c5890365bdbe5d25b97ce0057589acaef4f1a57263f
            .nTime    = 1723649144,
            .tx_count = 1059312821,
            .dTxRate  = 6.721086701157182,
        };
    }